

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O0

void __thiscall
AdaptorTest_StackTest_Test::~AdaptorTest_StackTest_Test(AdaptorTest_StackTest_Test *this)

{
  void *in_RDI;
  
  ~AdaptorTest_StackTest_Test((AdaptorTest_StackTest_Test *)0x171ab8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(AdaptorTest, StackTest) {
    std::stack<int, Deque<int>> s;
    for (int i = 0; i < 100; ++i) {
        s.push(i);
    }

    for (int i = 99; i >= 0; --i) {
        ASSERT_FALSE(s.empty());
        ASSERT_EQ(s.top(), i);
        s.pop();
    }
}